

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O1

int uv__setsockopt_maybe_char(uv_udp_t *handle,int option4,int option6,int val)

{
  int *piVar1;
  int iVar2;
  int arg;
  undefined1 local_4 [4];
  
  iVar2 = -0x16;
  if ((uint)val < 0x100) {
    if ((handle->flags & 0x400000) == 0) {
      iVar2 = 0;
    }
    else {
      iVar2 = 0x29;
      option4 = option6;
    }
    iVar2 = setsockopt((handle->io_watcher).fd,iVar2,option4,local_4,4);
    if (iVar2 == 0) {
      iVar2 = 0;
    }
    else {
      piVar1 = __errno_location();
      iVar2 = -*piVar1;
    }
  }
  return iVar2;
}

Assistant:

static int uv__setsockopt_maybe_char(uv_udp_t* handle,
                                     int option4,
                                     int option6,
                                     int val) {
#if defined(__sun) || defined(_AIX) || defined(__MVS__)
  char arg = val;
#elif defined(__OpenBSD__)
  unsigned char arg = val;
#else
  int arg = val;
#endif

  if (val < 0 || val > 255)
    return UV_EINVAL;

  return uv__setsockopt(handle, option4, option6, &arg, sizeof(arg));
}